

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

void __thiscall r_exec::HLPBindingMap::reset_bwd_timings(HLPBindingMap *this,_Fact *reference_fact)

{
  short sVar1;
  pointer pPVar2;
  StructureValue *pSVar3;
  atomic_int_fast64_t *paVar4;
  uint16_t uVar5;
  StructureValue *pSVar6;
  
  pSVar6 = (StructureValue *)operator_new(0x20);
  (*(reference_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
    super_Code.super__Object._vptr__Object[4])(reference_fact,2);
  uVar5 = r_code::Atom::asIndex();
  StructureValue::StructureValue(pSVar6,&this->super_BindingMap,(Code *)reference_fact,uVar5);
  sVar1 = *(short *)&(this->super_BindingMap).field_0x36;
  pPVar2 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (StructureValue *)pPVar2[sVar1].object;
  if (pSVar3 != pSVar6) {
    if (pSVar3 != (StructureValue *)0x0) {
      LOCK();
      paVar4 = &(pSVar3->super_BoundValue).super_Value.super__Object.refCount;
      (paVar4->super___atomic_base<long>)._M_i = (paVar4->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar3->super_BoundValue).super_Value.super__Object.refCount.super___atomic_base<long>.
          _M_i < 1) {
        (*(pSVar3->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
      }
    }
    pPVar2[sVar1].object = (_Object *)pSVar6;
    LOCK();
    paVar4 = &(pSVar6->super_BoundValue).super_Value.super__Object.refCount;
    (paVar4->super___atomic_base<long>)._M_i = (paVar4->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  pSVar6 = (StructureValue *)operator_new(0x20);
  (*(reference_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
    super_Code.super__Object._vptr__Object[4])(reference_fact,3);
  uVar5 = r_code::Atom::asIndex();
  StructureValue::StructureValue(pSVar6,&this->super_BindingMap,(Code *)reference_fact,uVar5);
  sVar1 = this->bwd_before_index;
  pPVar2 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (StructureValue *)pPVar2[sVar1].object;
  if (pSVar3 != pSVar6) {
    if (pSVar3 != (StructureValue *)0x0) {
      LOCK();
      paVar4 = &(pSVar3->super_BoundValue).super_Value.super__Object.refCount;
      (paVar4->super___atomic_base<long>)._M_i = (paVar4->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar3->super_BoundValue).super_Value.super__Object.refCount.super___atomic_base<long>.
          _M_i < 1) {
        (*(pSVar3->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
      }
    }
    pPVar2[sVar1].object = (_Object *)pSVar6;
    LOCK();
    paVar4 = &(pSVar6->super_BoundValue).super_Value.super__Object.refCount;
    (paVar4->super___atomic_base<long>)._M_i = (paVar4->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void HLPBindingMap::reset_bwd_timings(_Fact *reference_fact)   // valuate at after_index and after_index+1 from the timings of the reference fact.
{
    map[bwd_after_index] = new StructureValue(this, reference_fact, reference_fact->code(FACT_AFTER).asIndex());
    map[bwd_before_index] = new StructureValue(this, reference_fact, reference_fact->code(FACT_BEFORE).asIndex());
}